

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

bool anon_unknown.dwarf_d5ce74::operator==
               (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *l,JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *r)

{
  __type _Var1;
  bool local_19;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *r_local;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *l_local;
  
  _Var1 = std::operator==(&l->Value,&r->Value);
  local_19 = false;
  if (_Var1) {
    local_19 = (l->Backtrace).Index == (r->Backtrace).Index;
  }
  return local_19;
}

Assistant:

bool operator==(JBT<T> const& l, JBT<T> const& r)
  {
    return l.Value == r.Value && l.Backtrace.Index == r.Backtrace.Index;
  }